

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void tr_init(TestResult *tr)

{
  TestResult *tr_local;
  
  tr->ctx = CK_CTX_INVALID;
  tr->line = -1;
  tr->rtype = CK_TEST_RESULT_INVALID;
  tr->msg = (char *)0x0;
  tr->file = (char *)0x0;
  tr->tcname = (char *)0x0;
  tr->tname = (char *)0x0;
  tr->duration = -1;
  return;
}

Assistant:

static void tr_init(TestResult * tr)
{
    tr->ctx = CK_CTX_INVALID;
    tr->line = -1;
    tr->rtype = CK_TEST_RESULT_INVALID;
    tr->msg = NULL;
    tr->file = NULL;
    tr->tcname = NULL;
    tr->tname = NULL;
    tr->duration = -1;
}